

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O2

void __thiscall QOpenGLWindow::~QOpenGLWindow(QOpenGLWindow *this)

{
  long lVar1;
  bool bVar2;
  
  *(undefined ***)this = &PTR_metaObject_001a1600;
  *(undefined ***)&this->field_0x10 = &PTR__QOpenGLWindow_001a1778;
  *(undefined ***)&this->field_0x28 = &PTR__QOpenGLWindow_001a17b8;
  lVar1 = *(long *)&this->field_0x8;
  makeCurrent(this);
  bVar2 = isValid(this);
  if (bVar2) {
    QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>::
    reset((QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>
           *)(lVar1 + 0x1a8),(QOpenGLWindowPaintDevice *)0x0);
    QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>::
    reset((QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>
           *)(lVar1 + 0x1a0),(QOpenGLFramebufferObject *)0x0);
    QOpenGLTextureBlitter::destroy((QOpenGLTextureBlitter *)(lVar1 + 0x1b0));
  }
  doneCurrent(this);
  QPaintDeviceWindow::~QPaintDeviceWindow(&this->super_QPaintDeviceWindow);
  return;
}

Assistant:

QOpenGLWindow::~QOpenGLWindow()
{
    Q_D(QOpenGLWindow);

    makeCurrent(); // this works even when the platformwindow is destroyed
    if (isValid()) {
        d->paintDevice.reset(nullptr);
        d->fbo.reset(nullptr);
        d->blitter.destroy();
    }
    doneCurrent();
}